

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O1

void __thiscall crnlib::etc1_optimizer::~etc1_optimizer(etc1_optimizer *this)

{
  uchar *puVar1;
  void *p;
  unsigned_short *p_00;
  long lVar2;
  
  puVar1 = (this->m_temp_selectors).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_trial_solution).m_selectors.m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_best_solution).m_selectors.m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_best_selectors).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  puVar1 = (this->m_selectors).m_p;
  if (puVar1 != (uchar *)0x0) {
    crnlib_free(puVar1);
  }
  lVar2 = 0x50;
  do {
    p = *(void **)((long)(this->m_avg_color).m_s + lVar2 + -0x14);
    if (p != (void *)0x0) {
      crnlib_free(p);
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0x30);
  p_00 = (this->m_luma).m_p;
  if (p_00 != (unsigned_short *)0x0) {
    crnlib_free(p_00);
  }
  return;
}

Assistant:

class CRN_EXPORT etc1_optimizer
    {
        CRNLIB_NO_COPY_OR_ASSIGNMENT_OP(etc1_optimizer);

    public:
        etc1_optimizer()
        {
            clear();
        }

        void clear()
        {
            m_pParams = nullptr;
            m_pResult = nullptr;
            m_pSorted_luma = nullptr;
            m_pSorted_luma_indices = nullptr;
        }

        struct params : crn_etc1_pack_params
        {
            params()
            {
                clear();
            }

            params(const crn_etc1_pack_params& base_params) :
                crn_etc1_pack_params(base_params)
            {
                clear_optimizer_params();
            }

            void clear()
            {
                crn_etc1_pack_params::clear();
                clear_optimizer_params();
            }

            void clear_optimizer_params()
            {
                m_num_src_pixels = 0;
                m_pSrc_pixels = 0;

                m_use_color4 = false;
                static const int s_default_scan_delta[] = { 0 };
                m_pScan_deltas = s_default_scan_delta;
                m_scan_delta_size = 1;

                m_base_color5.clear();
                m_constrain_against_base_color5 = false;
            }

            uint m_num_src_pixels;
            const color_quad_u8* m_pSrc_pixels;

            bool m_use_color4;
            const int* m_pScan_deltas;
            uint m_scan_delta_size;

            color_quad_u8 m_base_color5;
            bool m_constrain_against_base_color5;
        };

        struct results
        {
            uint64 m_error;
            color_quad_u8 m_block_color_unscaled;
            uint m_block_inten_table;
            uint m_n;
            uint8* m_pSelectors;
            bool m_block_color4;

            inline results& operator=(const results& rhs)
            {
                m_block_color_unscaled = rhs.m_block_color_unscaled;
                m_block_color4 = rhs.m_block_color4;
                m_block_inten_table = rhs.m_block_inten_table;
                m_error = rhs.m_error;
                CRNLIB_ASSERT(m_n == rhs.m_n);
                memcpy(m_pSelectors, rhs.m_pSelectors, rhs.m_n);
                return *this;
            }
        };

        void init(const params& params, results& result);
        bool compute();

    private:
        struct potential_solution
        {
            potential_solution() :
                m_coords(), m_error(cUINT64_MAX), m_valid(false)
            {
            }

            etc1_solution_coordinates m_coords;
            crnlib::vector<uint8> m_selectors;
            uint64 m_error;
            bool m_valid;

            void clear()
            {
                m_coords.clear();
                m_selectors.resize(0);
                m_error = cUINT64_MAX;
                m_valid = false;
            }

            bool are_selectors_all_equal() const
            {
                if (m_selectors.empty())
                {
                    return false;
                }
                const uint s = m_selectors[0];
                for (uint i = 1; i < m_selectors.size(); i++)
                {
                    if (m_selectors[i] != s)
                    {
                        return false;
                    }
                }
                return true;
            }
        };

        const params* m_pParams;
        results* m_pResult;

        int m_limit;

        vec3F m_avg_color;
        int m_br, m_bg, m_bb;
        crnlib::vector<uint16> m_luma;
        crnlib::vector<uint32> m_sorted_luma[2];
        const uint32* m_pSorted_luma_indices;
        uint32* m_pSorted_luma;

        crnlib::vector<uint8> m_selectors;
        crnlib::vector<uint8> m_best_selectors;

        potential_solution m_best_solution;
        potential_solution m_trial_solution;
        crnlib::vector<uint8> m_temp_selectors;

        bool evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution);
        bool evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution);
    }